

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

xmlChar * xmlURIEscapeStr(xmlChar *str,xmlChar *list)

{
  byte *pbVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlChar xVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  int len;
  int local_34;
  
  if (str != (xmlChar *)0x0) {
    if (*str == '\0') {
      pxVar3 = xmlStrdup(str);
      return pxVar3;
    }
    iVar2 = xmlStrlen(str);
    if (0 < iVar2) {
      pxVar3 = (xmlChar *)(*xmlMallocAtomic)((size_t)(iVar2 + 0x14));
      if (pxVar3 != (xmlChar *)0x0) {
        uVar8 = 0;
        if (*str != '\0') {
          pxVar4 = pxVar3;
          local_34 = iVar2 + 0x14;
          do {
            iVar2 = (int)uVar8;
            pxVar3 = pxVar4;
            if ((local_34 - iVar2 < 4) &&
               (pxVar3 = xmlSaveUriRealloc(pxVar4,&local_34), pxVar3 == (xmlChar *)0x0)) {
              xmlURIErrMemory("escaping URI value\n");
              (*xmlFree)(pxVar4);
              return (xmlChar *)0x0;
            }
            bVar9 = *str;
            if (((((byte)(bVar9 - 0x30) < 10) || ((byte)(bVar9 - 0x40) < 0x1b)) ||
                ((byte)(bVar9 + 0x9f) < 0x1a)) ||
               (((bVar9 - 0x21 < 0x3f &&
                 ((0x40000000000033c1U >> ((ulong)(bVar9 - 0x21) & 0x3f) & 1) != 0)) ||
                ((bVar9 == 0x7e || (pxVar4 = xmlStrchr(list,bVar9), pxVar4 != (xmlChar *)0x0)))))) {
              uVar7 = iVar2 + 1;
              pxVar3[iVar2] = *str;
            }
            else {
              bVar6 = (bVar9 >> 4) + 0x37;
              if (bVar9 < 0xa0) {
                bVar6 = bVar9 >> 4 | 0x30;
              }
              pxVar3[iVar2] = '%';
              pxVar3[(long)iVar2 + 1] = bVar6;
              bVar9 = bVar9 & 0xf;
              xVar5 = bVar9 + 0x37;
              if (bVar9 < 10) {
                xVar5 = bVar9 + 0x30;
              }
              pxVar3[(long)iVar2 + 2] = xVar5;
              uVar7 = iVar2 + 3;
            }
            uVar8 = (ulong)uVar7;
            pbVar1 = str + 1;
            str = str + 1;
            pxVar4 = pxVar3;
          } while (*pbVar1 != 0);
          uVar8 = (ulong)(int)uVar7;
        }
        pxVar3[uVar8] = '\0';
        return pxVar3;
      }
      xmlURIErrMemory("escaping URI value\n");
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlURIEscapeStr(const xmlChar *str, const xmlChar *list) {
    xmlChar *ret, ch;
    xmlChar *temp;
    const xmlChar *in;
    int len, out;

    if (str == NULL)
	return(NULL);
    if (str[0] == 0)
	return(xmlStrdup(str));
    len = xmlStrlen(str);
    if (!(len > 0)) return(NULL);

    len += 20;
    ret = (xmlChar *) xmlMallocAtomic(len);
    if (ret == NULL) {
        xmlURIErrMemory("escaping URI value\n");
	return(NULL);
    }
    in = (const xmlChar *) str;
    out = 0;
    while(*in != 0) {
	if (len - out <= 3) {
            temp = xmlSaveUriRealloc(ret, &len);
	    if (temp == NULL) {
                xmlURIErrMemory("escaping URI value\n");
		xmlFree(ret);
		return(NULL);
	    }
	    ret = temp;
	}

	ch = *in;

	if ((ch != '@') && (!IS_UNRESERVED(ch)) && (!xmlStrchr(list, ch))) {
	    unsigned char val;
	    ret[out++] = '%';
	    val = ch >> 4;
	    if (val <= 9)
		ret[out++] = '0' + val;
	    else
		ret[out++] = 'A' + val - 0xA;
	    val = ch & 0xF;
	    if (val <= 9)
		ret[out++] = '0' + val;
	    else
		ret[out++] = 'A' + val - 0xA;
	    in++;
	} else {
	    ret[out++] = *in++;
	}

    }
    ret[out] = 0;
    return(ret);
}